

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_signal.cpp
# Opt level: O0

BentoAbstract ** CsSignal::SignalBase::get_threadLocal_currentSignal(void)

{
  BentoAbstract **ppBVar1;
  
  ppBVar1 = (BentoAbstract **)__tls_get_addr(&PTR_0012cfb8);
  return ppBVar1;
}

Assistant:

CsSignal::Internal::BentoAbstract *&CsSignal::SignalBase::get_threadLocal_currentSignal()
{

#ifdef __APPLE__
   static __thread CsSignal::Internal::BentoAbstract *threadLocal_currentSignal = nullptr;
#else
   static thread_local CsSignal::Internal::BentoAbstract *threadLocal_currentSignal = nullptr;
#endif

   return threadLocal_currentSignal;
}